

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O2

Float pbrt::I0(Float x)

{
  int i;
  int iVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  uVar2 = 1;
  lVar3 = 1;
  fVar6 = 1.0;
  fVar5 = 0.0;
  for (iVar1 = 0; iVar1 != 10; iVar1 = iVar1 + 1) {
    lVar3 = lVar3 * (ulong)(iVar1 + (uint)(iVar1 == 0));
    uVar4 = (ulong)uVar2;
    uVar2 = uVar2 << 2;
    fVar7 = fVar6 / (float)(long)(uVar4 * lVar3 * lVar3);
    fVar6 = x * x * fVar6;
    fVar5 = fVar5 + fVar7;
  }
  return fVar5;
}

Assistant:

PBRT_CPU_GPU
inline Float I0(Float x) {
    Float val = 0;
    Float x2i = 1;
    int64_t ifact = 1;
    int i4 = 1;
    // I0(x) \approx Sum_i x^(2i) / (4^i (i!)^2)
    for (int i = 0; i < 10; ++i) {
        if (i > 1)
            ifact *= i;
        val += x2i / (i4 * Sqr(ifact));
        x2i *= x * x;
        i4 *= 4;
    }
    return val;
}